

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_node_addchild(lys_node *parent,lys_module *module,lys_node *child,int options)

{
  undefined2 uVar1;
  lys_module *plVar2;
  LYS_NODE LVar3;
  LYS_NODE LVar4;
  LY_STMT stmt;
  int iVar5;
  void *pvVar6;
  char *pcVar7;
  lys_node **pplVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  char *pcVar11;
  lys_node **pplVar12;
  LY_VLOG_ELEM elem_type;
  LY_ECODE ecode;
  ly_ctx *plVar13;
  bool bVar14;
  lyext_substmt *local_48;
  lyext_substmt *info;
  ly_ctx *local_38;
  
  local_38 = child->module->ctx;
  local_48 = (lyext_substmt *)0x0;
  if (child == (lys_node *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x2fe,
                  "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                 );
  }
  info._4_4_ = options;
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x31a,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                   );
    }
    if ((child->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) {
      __assert_fail("!(child->nodetype & (LYS_INPUT | LYS_OUTPUT))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x31b,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                   );
    }
LAB_0015d7f7:
    plVar9 = (lys_node *)0x0;
    LVar4 = LYS_UNKNOWN;
  }
  else {
    LVar4 = parent->nodetype;
    module = parent->module;
    plVar9 = parent;
    if (LVar4 == LYS_USES) {
      do {
        LVar4 = plVar9->nodetype;
        if (LVar4 != LYS_USES) goto LAB_0015d7fc;
        plVar9 = plVar9->parent;
      } while (plVar9 != (lys_node *)0x0);
      goto LAB_0015d7f7;
    }
  }
LAB_0015d7fc:
  bVar14 = true;
  if ((int)LVar4 < 0x100) {
    if ((int)LVar4 < 0x10) {
      switch(LVar4) {
      case LYS_UNKNOWN:
        if ((child->nodetype & 0xb9bf) != LYS_UNKNOWN) goto switchD_0015d827_caseD_3;
        pcVar7 = strnodetype(child->nodetype);
        pcVar11 = "(sub)module";
        break;
      case LYS_CONTAINER:
switchD_0015d827_caseD_1:
        LVar4 = child->nodetype;
        LVar3 = LVar4 & 0xd8bf;
        goto joined_r0x0015d99b;
      case LYS_CHOICE:
        LVar4 = child->nodetype;
        if ((LVar4 & 0x807f) != LYS_UNKNOWN) {
          bVar14 = LVar4 == LYS_CASE;
          goto switchD_0015d827_caseD_3;
        }
        pcVar7 = strnodetype(LVar4);
        pcVar11 = "choice";
        break;
      default:
        goto switchD_0015d827_caseD_3;
      case LYS_LEAF:
      case LYS_LEAFLIST:
switchD_0015d827_caseD_4:
        pcVar11 = strnodetype(child->nodetype);
        pcVar7 = strnodetype(plVar9->nodetype);
        plVar13 = local_38;
        ly_vlog(local_38,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar9,pcVar11,pcVar7);
        pcVar11 = strnodetype(plVar9->nodetype);
        pcVar7 = "The \"%s\" statement cannot have any data substatement.";
        ecode = LYE_SPEC;
        elem_type = LY_VLOG_PREV;
        plVar9 = (lys_node *)0x0;
        goto LAB_0015de7b;
      }
    }
    else {
      if ((int)LVar4 < 0x40) {
        if (LVar4 != LYS_LIST) {
          if (LVar4 != LYS_ANYXML) goto switchD_0015d827_caseD_3;
          goto switchD_0015d827_caseD_4;
        }
        goto switchD_0015d827_caseD_1;
      }
      if (LVar4 != LYS_CASE) {
        if (LVar4 != LYS_NOTIF) goto switchD_0015d827_caseD_3;
        goto LAB_0015d96d;
      }
      if ((child->nodetype & 0x903f) != LYS_UNKNOWN) goto switchD_0015d827_caseD_3;
      pcVar7 = strnodetype(child->nodetype);
      pcVar11 = "case";
    }
LAB_0015de67:
    ecode = LYE_INCHILDSTMT;
    elem_type = LY_VLOG_LYS;
    plVar13 = local_38;
  }
  else {
    if ((int)LVar4 < 0x1000) {
      if ((int)LVar4 < 0x400) {
        if (LVar4 == LYS_RPC) goto LAB_0015d9dc;
        if (LVar4 != LYS_INPUT) goto switchD_0015d827_caseD_3;
      }
      else if (LVar4 != LYS_OUTPUT) {
        if (LVar4 != LYS_GROUPING) goto switchD_0015d827_caseD_3;
        goto switchD_0015d827_caseD_1;
      }
LAB_0015d96d:
      LVar4 = child->nodetype;
      LVar3 = LVar4 & 0x983f;
    }
    else {
      if (0x3fff < (int)LVar4) {
        if (LVar4 != LYS_ACTION) {
          if (LVar4 == LYS_ANYDATA) goto switchD_0015d827_caseD_4;
          if (LVar4 != LYS_EXT) goto switchD_0015d827_caseD_3;
          stmt = lys_snode2stmt(child->nodetype);
          pvVar6 = lys_ext_complex_get_substmt(stmt,(lys_ext_instance_complex *)plVar9,&local_48);
          if (pvVar6 != (void *)0x0) goto switchD_0015d827_caseD_3;
          pcVar7 = strnodetype(child->nodetype);
          pcVar11 = *(char **)plVar9->name;
          goto LAB_0015de67;
        }
LAB_0015d9dc:
        if ((child->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN)
        goto switchD_0015d827_caseD_3;
        pcVar7 = strnodetype(child->nodetype);
        pcVar11 = "rpc";
        goto LAB_0015de67;
      }
      if (LVar4 == LYS_USES) goto switchD_0015d827_caseD_1;
      if (LVar4 != LYS_AUGMENT) goto switchD_0015d827_caseD_3;
      LVar4 = child->nodetype;
      LVar3 = LVar4 & 0xd0ff;
    }
joined_r0x0015d99b:
    if (LVar3 != LYS_UNKNOWN) {
switchD_0015d827_caseD_3:
      if ((((module->ctx->models).flags & 2) == 0) &&
         (iVar5 = lys_check_id(child,parent,module), iVar5 != 0)) {
        return 1;
      }
      if (child->parent != (lys_node *)0x0) {
        lys_node_unlink(child);
      }
      if (((child->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) &&
         (parent->nodetype != LYS_EXT)) {
        plVar9 = parent->child;
        if (plVar9 != (lys_node *)0x0) {
          pplVar8 = &parent->child;
          do {
            if (plVar9->nodetype == child->nodetype) {
              pplVar12 = pplVar8;
              if (*pplVar8 != plVar9) {
                pplVar12 = &plVar9->prev->next;
              }
              *pplVar12 = child;
              child->prev = plVar9->prev;
              child->next = plVar9->next;
              plVar10 = plVar9->next;
              if (plVar10 == (lys_node *)0x0) {
                plVar10 = *pplVar8;
              }
              plVar10->prev = child;
              child->parent = parent;
              plVar9->next = (lys_node *)0x0;
              plVar9->prev = plVar9;
              plVar9->parent = (lys_node *)0x0;
              lys_node_free(plVar9,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
              goto LAB_0015dc29;
            }
            plVar9 = plVar9->next;
          } while (plVar9 != (lys_node *)0x0);
        }
        __assert_fail("iter",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                      ,0x385,
                      "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                     );
      }
      if (!bVar14) {
        plVar9 = (lys_node *)calloc(1,0x70);
        if (plVar9 == (lys_node *)0x0) {
          ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_addchild");
          return 1;
        }
        pcVar11 = lydict_insert(module->ctx,child->name,0);
        plVar9->name = pcVar11;
        plVar9->flags = 0x40;
        if ((info._4_4_ & 3) == 0) {
          plVar9->flags = parent->flags & 3 | 0x40;
        }
        plVar9->module = module;
        plVar9->nodetype = LYS_CASE;
        plVar9->prev = plVar9;
        lys_node_addchild(parent,module,plVar9,info._4_4_);
        parent = plVar9;
      }
      if (parent == (lys_node *)0x0) {
        plVar9 = module->data;
        if (plVar9 == (lys_node *)0x0) {
          module->data = child;
        }
        else {
          plVar10 = plVar9->prev;
          plVar10->next = child;
          child->prev = plVar10;
          plVar9->prev = child;
        }
        parent = (lys_node *)0x0;
      }
      else {
        pplVar8 = lys_child(parent,child->nodetype);
        if (pplVar8 == (lys_node **)0x0) {
          __assert_fail("pchild",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                        ,0x3ba,
                        "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                       );
        }
        child->parent = parent;
        if (*pplVar8 == (lys_node *)0x0) {
          *pplVar8 = child;
          plVar9 = child;
        }
        else {
          plVar9 = (*pplVar8)->prev;
          plVar9->next = child;
          child->prev = plVar9;
        }
        for (plVar10 = plVar9->next; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
          plVar10->parent = parent;
          plVar9 = plVar10;
        }
        (*pplVar8)->prev = plVar9;
      }
LAB_0015dc29:
      plVar13 = local_38;
      bVar14 = parent != (lys_node *)0x0;
      if (bVar14) {
        uVar1 = *(undefined2 *)((long)&parent->nodetype + 1);
        plVar9 = parent;
        while ((uVar1 & (LYS_EXT|LYS_AUGMENT|LYS_GROUPING) >> 8) == LYS_UNKNOWN >> 8) {
          plVar9 = plVar9->parent;
          bVar14 = plVar9 != (lys_node *)0x0;
          if (plVar9 == (lys_node *)0x0) break;
          uVar1 = *(undefined2 *)((long)&plVar9->nodetype + 1);
        }
      }
      if (!(bool)(parent == (lys_node *)0x0 | bVar14)) {
        plVar9 = child;
        if (child != (lys_node *)0x0) {
          do {
            if ((plVar9->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN)
            goto LAB_0015dc92;
            pplVar8 = &plVar9->parent;
            plVar9 = *pplVar8;
          } while (*pplVar8 != (lys_node *)0x0);
        }
        if (((parent->flags & 2) != 0) && ((child->flags & 1) != 0)) {
          ly_vlog(local_38,LYE_INARG,LY_VLOG_LYS,child,"true","config");
          ly_vlog(plVar13,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                  "State nodes cannot have configuration nodes as children.");
          return 1;
        }
      }
LAB_0015dc92:
      LVar4 = child->nodetype;
      if (((LVar4 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
           LYS_UNKNOWN) && (parent != (lys_node *)0x0 && (child->flags & 0x80) != 0)) {
        do {
          if ((parent->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) {
            if ((char)parent->flags < '\0') break;
            parent->flags = parent->flags | 0x80;
          }
          if (parent->nodetype == LYS_EXT) {
            if (parent->padding[1] == '\x01') {
              parent = (lys_node *)parent->dsc;
              goto LAB_0015dcea;
            }
LAB_0015dcfa:
            parent = (lys_node *)0x0;
          }
          else {
            parent = parent->parent;
            if (parent == (lys_node *)0x0) goto LAB_0015dcfa;
LAB_0015dcea:
            if (parent->nodetype == LYS_AUGMENT) {
              parent = parent->prev;
            }
          }
        } while (parent != (lys_node *)0x0);
      }
      if ((LVar4 & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
        return 0;
      }
      if (child->child == (lys_node *)0x0) {
        plVar9 = (lys_node *)calloc(1,0x78);
        plVar10 = (lys_node *)calloc(1,0x78);
        if (plVar9 == (lys_node *)0x0 || plVar10 == (lys_node *)0x0) {
          ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_addchild");
          free(plVar9);
          free(plVar10);
          return 1;
        }
        plVar9->nodetype = LYS_INPUT;
        pcVar11 = lydict_insert(child->module->ctx,"input",5);
        plVar9->name = pcVar11;
        plVar10->nodetype = LYS_OUTPUT;
        pcVar11 = lydict_insert(child->module->ctx,"output",6);
        plVar10->name = pcVar11;
        plVar2 = child->module;
        plVar10->module = plVar2;
        plVar9->module = plVar2;
        plVar10->parent = child;
        plVar9->parent = child;
        plVar10->flags = 0x40;
        plVar9->flags = 0x40;
        plVar9->next = plVar10;
        plVar9->prev = plVar10;
        plVar10->prev = plVar9;
        child->child = plVar9;
        return 0;
      }
      return 0;
    }
    pcVar7 = strnodetype(LVar4);
    pcVar11 = strnodetype(plVar9->nodetype);
    ecode = LYE_INCHILDSTMT;
    elem_type = LY_VLOG_LYS;
    plVar13 = local_38;
  }
LAB_0015de7b:
  ly_vlog(plVar13,ecode,elem_type,plVar9,pcVar7,pcVar11);
  return 1;
}

Assistant:

int
lys_node_addchild(struct lys_node *parent, struct lys_module *module, struct lys_node *child, int options)
{
    struct ly_ctx *ctx = child->module->ctx;
    struct lys_node *iter, **pchild, *log_parent;
    struct lys_node_inout *in, *out;
    struct lys_node_case *c;
    struct lys_node_augment *aug;
    int type, shortcase = 0;
    void *p;
    struct lyext_substmt *info = NULL;

    assert(child);

    if (parent) {
        type = parent->nodetype;
        module = parent->module;
        log_parent = parent;

        if (type == LYS_USES) {
            /* we are adding children to uses -> we must be copying grouping contents into it, so properly check the parent */
            while (log_parent && (log_parent->nodetype == LYS_USES)) {
                if (log_parent->nodetype == LYS_AUGMENT) {
                    aug = (struct lys_node_augment *)log_parent;
                    if (!aug->target) {
                        /* unresolved augment, just pass the node type check */
                        goto skip_nodetype_check;
                    }
                    log_parent = aug->target;
                } else {
                    log_parent = log_parent->parent;
                }
            }
            if (log_parent) {
                type = log_parent->nodetype;
            } else {
                type = 0;
            }
        }
    } else {
        assert(module);
        assert(!(child->nodetype & (LYS_INPUT | LYS_OUTPUT)));
        type = 0;
        log_parent = NULL;
    }

    /* checks */
    switch (type) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
    case LYS_USES:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_CHOICE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "choice");
            return EXIT_FAILURE;
        }
        if (child->nodetype != LYS_CASE) {
            shortcase = 1;
        }
        break;
    case LYS_CASE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "case");
            return EXIT_FAILURE;
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        if (!(child->nodetype & (LYS_INPUT | LYS_OUTPUT | LYS_GROUPING))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "rpc");
            return EXIT_FAILURE;
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "The \"%s\" statement cannot have any data substatement.",
               strnodetype(log_parent->nodetype));
        return EXIT_FAILURE;
    case LYS_AUGMENT:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_UNKNOWN:
        /* top level */
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_GROUPING
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_RPC | LYS_NOTIF | LYS_AUGMENT))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "(sub)module");
            return EXIT_FAILURE;
        }
        break;
    case LYS_EXT:
        /* plugin-defined */
        p = lys_ext_complex_get_substmt(lys_snode2stmt(child->nodetype), (struct lys_ext_instance_complex*)log_parent, &info);
        if (!p) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype),
                   ((struct lys_ext_instance_complex*)log_parent)->def->name);
            return EXIT_FAILURE;
        }
        /* TODO check cardinality */
        break;
    }

skip_nodetype_check:
    /* check identifier uniqueness */
    if (!(module->ctx->models.flags & LY_CTX_TRUSTED) && lys_check_id(child, parent, module)) {
        return EXIT_FAILURE;
    }

    if (child->parent) {
        lys_node_unlink(child);
    }

    if ((child->nodetype & (LYS_INPUT | LYS_OUTPUT)) && parent->nodetype != LYS_EXT) {
        /* find the implicit input/output node */
        LY_TREE_FOR(parent->child, iter) {
            if (iter->nodetype == child->nodetype) {
                break;
            }
        }
        assert(iter);

        /* switch the old implicit node (iter) with the new one (child) */
        if (parent->child == iter) {
            /* first child */
            parent->child = child;
        } else {
            iter->prev->next = child;
        }
        child->prev = iter->prev;
        child->next = iter->next;
        if (iter->next) {
            iter->next->prev = child;
        } else {
            /* last child */
            parent->child->prev = child;
        }
        child->parent = parent;

        /* isolate the node and free it */
        iter->next = NULL;
        iter->prev = iter;
        iter->parent = NULL;
        lys_node_free(iter, NULL, 0);
    } else {
        if (shortcase) {
            /* create the implicit case to allow it to serve as a target of the augments,
             * it won't be printed, but it will be present in the tree */
            c = calloc(1, sizeof *c);
            LY_CHECK_ERR_RETURN(!c, LOGMEM(ctx), EXIT_FAILURE);
            c->name = lydict_insert(module->ctx, child->name, 0);
            c->flags = LYS_IMPLICIT;
            if (!(options & (LYS_PARSE_OPT_CFG_IGNORE | LYS_PARSE_OPT_CFG_NOINHERIT))) {
                /* get config flag from parent */
                c->flags |= parent->flags & LYS_CONFIG_MASK;
            }
            c->module = module;
            c->nodetype = LYS_CASE;
            c->prev = (struct lys_node*)c;
            lys_node_addchild(parent, module, (struct lys_node*)c, options);
            parent = (struct lys_node*)c;
        }
        /* connect the child correctly */
        if (!parent) {
            if (module->data) {
                module->data->prev->next = child;
                child->prev = module->data->prev;
                module->data->prev = child;
            } else {
                module->data = child;
            }
        } else {
            pchild = lys_child(parent, child->nodetype);
            assert(pchild);

            child->parent = parent;
            if (!(*pchild)) {
                /* the only/first child of the parent */
                *pchild = child;
                iter = child;
            } else {
                /* add a new child at the end of parent's child list */
                iter = (*pchild)->prev;
                iter->next = child;
                child->prev = iter;
            }
            while (iter->next) {
                iter = iter->next;
                iter->parent = parent;
            }
            (*pchild)->prev = iter;
        }
    }

    /* check config value (but ignore them in groupings and augments) */
    for (iter = parent; iter && !(iter->nodetype & (LYS_GROUPING | LYS_AUGMENT | LYS_EXT)); iter = iter->parent);
    if (parent && !iter) {
        for (iter = child; iter && !(iter->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); iter = iter->parent);
        if (!iter && (parent->flags & LYS_CONFIG_R) && (child->flags & LYS_CONFIG_W)) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, child, "true", "config");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
            return EXIT_FAILURE;
        }
    }

    /* propagate information about status data presence */
    if ((child->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) &&
            (child->flags & LYS_INCL_STATUS)) {
        for(iter = parent; iter; iter = lys_parent(iter)) {
            /* store it only into container or list - the only data inner nodes */
            if (iter->nodetype & (LYS_CONTAINER | LYS_LIST)) {
                if (iter->flags & LYS_INCL_STATUS) {
                    /* done, someone else set it already from here */
                    break;
                }
                /* set flag about including status data */
                iter->flags |= LYS_INCL_STATUS;
            }
        }
    }

    /* create implicit input/output nodes to have available them as possible target for augment */
    if ((child->nodetype & (LYS_RPC | LYS_ACTION)) && !child->child) {
        in = calloc(1, sizeof *in);
        out = calloc(1, sizeof *out);
        if (!in || !out) {
            LOGMEM(ctx);
            free(in);
            free(out);
            return EXIT_FAILURE;
        }
        in->nodetype = LYS_INPUT;
        in->name = lydict_insert(child->module->ctx, "input", 5);
        out->nodetype = LYS_OUTPUT;
        out->name = lydict_insert(child->module->ctx, "output", 6);
        in->module = out->module = child->module;
        in->parent = out->parent = child;
        in->flags = out->flags = LYS_IMPLICIT;
        in->next = (struct lys_node *)out;
        in->prev = (struct lys_node *)out;
        out->prev = (struct lys_node *)in;
        child->child = (struct lys_node *)in;
    }
    return EXIT_SUCCESS;
}